

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

bool Kumu::PathIsFile(string *pathname)

{
  int iVar1;
  ulong uVar2;
  char *path;
  Result_t local_110;
  undefined1 local_a8 [8];
  fstat_t info;
  string *pathname_local;
  
  info.__glibc_reserved[2] = (__syscall_slong_t)pathname;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    path = (char *)std::__cxx11::string::c_str();
    do_stat(&local_110,path,(fstat_t *)local_a8);
    iVar1 = Result_t::operator_cast_to_int(&local_110);
    Result_t::~Result_t(&local_110);
    if ((iVar1 < 0) || (((uint)info.st_nlink & 0xa000) == 0)) {
      pathname_local._7_1_ = false;
    }
    else {
      pathname_local._7_1_ = true;
    }
  }
  else {
    pathname_local._7_1_ = false;
  }
  return pathname_local._7_1_;
}

Assistant:

bool
Kumu::PathIsFile(const std::string& pathname)
{
  if ( pathname.empty() )
    return false;

  fstat_t info;

  if ( KM_SUCCESS(do_stat(pathname.c_str(), &info)) )
    {
      if ( info.st_mode & ( S_IFREG|S_IFLNK ) )
        return true;
    }

  return false;
}